

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateNonterminalEnum
          (GrammarOutputC *this,String *str,String *name,String *prefix)

{
  String **ppSVar1;
  Grammar *this_00;
  long *plVar2;
  long *plVar3;
  anon_class_8_1_82fec0c9 *paVar4;
  size_t sVar5;
  char *__lhs;
  undefined1 auStack_f8 [8];
  vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  nonterminalVec;
  String local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_t local_98;
  size_type *local_90;
  String dest;
  anon_class_32_4_842515b9 listEnumValues;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (this->super_GrammarOutput).pGrammar;
  if (this_00 == (Grammar *)0x0) {
    sVar5 = 0;
  }
  else {
    local_90 = &dest._M_string_length;
    dest._M_dataplus._M_p = (pointer)0x0;
    dest._M_string_length._0_1_ = 0;
    nonterminalVec.
    super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    nonterminalVec.
    super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.field_2._M_allocated_capacity = (size_type)str;
    local_d8._M_string_length =
         Grammar::CreateNonterminalVector
                   (this_00,(vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                             *)auStack_f8);
    local_d8._M_dataplus._M_p = (pointer)auStack_f8;
    local_98 = local_d8._M_string_length;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,"//////////////////////////// ",name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&listEnumValues.enumValueNameGenerator);
    ppSVar1 = &listEnumValues.str;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      listEnumValues.str = (String *)*plVar3;
      listEnumValues.prefix = (String *)plVar2[3];
      dest.field_2._8_8_ = ppSVar1;
    }
    else {
      listEnumValues.str = (String *)*plVar3;
      dest.field_2._8_8_ = (long *)*plVar2;
    }
    listEnumValues.size = (size_t *)plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_90,dest.field_2._8_8_);
    if ((String **)dest.field_2._8_8_ != ppSVar1) {
      operator_delete((void *)dest.field_2._8_8_,
                      (ulong)((long)&((listEnumValues.str)->_M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)listEnumValues.enumValueNameGenerator != &local_40) {
      operator_delete(listEnumValues.enumValueNameGenerator,local_40._M_allocated_capacity + 1);
    }
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,"namespace ",&this->namespaceName);
      plVar2 = (long *)std::__cxx11::string::append((char *)&listEnumValues.enumValueNameGenerator);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        listEnumValues.str = (String *)*plVar3;
        listEnumValues.prefix = (String *)plVar2[3];
        dest.field_2._8_8_ = ppSVar1;
      }
      else {
        listEnumValues.str = (String *)*plVar3;
        dest.field_2._8_8_ = (long *)*plVar2;
      }
      listEnumValues.size = (size_t *)plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_90,dest.field_2._8_8_);
      if ((String **)dest.field_2._8_8_ != ppSVar1) {
        operator_delete((void *)dest.field_2._8_8_,
                        (ulong)((long)&((listEnumValues.str)->_M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)listEnumValues.enumValueNameGenerator != &local_40) {
        operator_delete(listEnumValues.enumValueNameGenerator,local_40._M_allocated_capacity + 1);
      }
    }
    __lhs = "enum ";
    if (this->useEnumClasses != false) {
      __lhs = "enum class ";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,__lhs,name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&listEnumValues.enumValueNameGenerator);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      listEnumValues.str = (String *)*plVar3;
      listEnumValues.prefix = (String *)plVar2[3];
      dest.field_2._8_8_ = ppSVar1;
    }
    else {
      listEnumValues.str = (String *)*plVar3;
      dest.field_2._8_8_ = (long *)*plVar2;
    }
    listEnumValues.size = (size_t *)plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_d8.field_2._8_8_ = name;
    std::__cxx11::string::_M_append((char *)&local_90,dest.field_2._8_8_);
    if ((String **)dest.field_2._8_8_ != ppSVar1) {
      operator_delete((void *)dest.field_2._8_8_,
                      (ulong)((long)&((listEnumValues.str)->_M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)listEnumValues.enumValueNameGenerator != &local_40) {
      operator_delete(listEnumValues.enumValueNameGenerator,local_40._M_allocated_capacity + 1);
    }
    dest.field_2._8_8_ = &local_d8._M_string_length;
    listEnumValues.prefix = &local_d8;
    local_40._M_allocated_capacity = local_40._M_allocated_capacity & 0xffffffffffffff00;
    listEnumValues.size = (size_t *)&local_90;
    listEnumValues.str = prefix;
    listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)&local_40;
    createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
    ::anon_class_32_4_842515b9::operator()
              ((anon_class_32_4_842515b9 *)((long)&dest.field_2 + 8),
               (String *)&listEnumValues.enumValueNameGenerator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)listEnumValues.enumValueNameGenerator != &local_40) {
      operator_delete(listEnumValues.enumValueNameGenerator,
                      (ulong)(local_40._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)&local_90);
    if (this->createEnumStrings == true) {
      std::operator+(&local_b8,"\nconstexpr char const* const StringifyEnum",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_d8.field_2._8_8_);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
      listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)&local_40;
      paVar4 = (anon_class_8_1_82fec0c9 *)(plVar2 + 2);
      if ((anon_class_8_1_82fec0c9 *)*plVar2 == paVar4) {
        local_40._M_allocated_capacity = (size_type)paVar4->nonterminalVec;
        local_40._8_8_ = plVar2[3];
      }
      else {
        local_40._M_allocated_capacity = (size_type)paVar4->nonterminalVec;
        listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)*plVar2;
      }
      *plVar2 = (long)paVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_90,(ulong)listEnumValues.enumValueNameGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)listEnumValues.enumValueNameGenerator != &local_40) {
        operator_delete(listEnumValues.enumValueNameGenerator,
                        (ulong)(local_40._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_40._M_allocated_capacity._0_2_ = 0x22;
      listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)&local_40;
      createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
      ::anon_class_32_4_842515b9::operator()
                ((anon_class_32_4_842515b9 *)((long)&dest.field_2 + 8),
                 (String *)&listEnumValues.enumValueNameGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)listEnumValues.enumValueNameGenerator != &local_40) {
        operator_delete(listEnumValues.enumValueNameGenerator,
                        (ulong)(local_40._M_allocated_capacity + 1));
      }
      std::__cxx11::string::append((char *)&local_90);
    }
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+(&local_b8,"\n} // namespace ",&this->namespaceName);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
      listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)&local_40;
      paVar4 = (anon_class_8_1_82fec0c9 *)(plVar2 + 2);
      if ((anon_class_8_1_82fec0c9 *)*plVar2 == paVar4) {
        local_40._M_allocated_capacity = (size_type)paVar4->nonterminalVec;
        local_40._8_8_ = plVar2[3];
      }
      else {
        local_40._M_allocated_capacity = (size_type)paVar4->nonterminalVec;
        listEnumValues.enumValueNameGenerator = (anon_class_8_1_82fec0c9 *)*plVar2;
      }
      *plVar2 = (long)paVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_90,(ulong)listEnumValues.enumValueNameGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)listEnumValues.enumValueNameGenerator != &local_40) {
        operator_delete(listEnumValues.enumValueNameGenerator,
                        (ulong)(local_40._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::swap((string *)local_d8.field_2._M_allocated_capacity);
    sVar5 = local_98;
    if (auStack_f8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_f8,
                      (long)nonterminalVec.
                            super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_f8);
    }
    if (local_90 != &dest._M_string_length) {
      operator_delete(local_90,CONCAT71(dest._M_string_length._1_7_,
                                        (undefined1)dest._M_string_length) + 1);
    }
  }
  return sVar5;
}

Assistant:

size_t GrammarOutputC::CreateNonterminalEnum(String& str, const String& name,
                                             const String& prefix) const {
    if (!pGrammar)
        return 0u;

    String dest;

    std::vector<const String*> nonterminalVec;
    const auto size = pGrammar->CreateNonterminalVector(nonterminalVec);

    // Generate strings
    createEnum(dest, name, prefix, size,
               [&](size_t index) {
                   const auto& valueName = *nonterminalVec[index];
                   // Check why this special case exists
                   return valueName == "[Accept1]" ? String{"Accept1"} : valueName;
               });

    str.swap(dest);

    return size;
}